

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.h
# Opt level: O3

void __thiscall cnn::FastLSTMBuilder::~FastLSTMBuilder(FastLSTMBuilder *this)

{
  pointer pEVar1;
  
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__FastLSTMBuilder_002a82e0;
  pEVar1 = (this->c0).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  pEVar1 = (this->h0).
           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pEVar1 != (pointer)0x0) {
    operator_delete(pEVar1);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->c);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->h);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&this->param_vars);
  std::
  vector<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
  ::~vector(&this->params);
  RNNBuilder::~RNNBuilder(&this->super_RNNBuilder);
  operator_delete(this);
  return;
}

Assistant:

FastLSTMBuilder() = default;